

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  IMkvReader *pReader;
  long lVar1;
  SeekHead *pSVar2;
  bool bVar3;
  long lVar4;
  Entry *pEVar5;
  long lVar6;
  long lVar7;
  longlong pos;
  longlong size;
  longlong id;
  uint local_74;
  long local_70;
  uint local_64;
  long local_60;
  VoidElement *local_58;
  Entry *local_50;
  long local_48;
  long local_40;
  SeekHead *local_38;
  
  pReader = this->m_pSegment->m_pReader;
  local_70 = this->m_start;
  lVar7 = this->m_size + local_70;
  local_64 = 0;
  local_74 = 0;
  local_38 = this;
  while (pSVar2 = local_38, local_70 < lVar7) {
    lVar4 = ParseElementHeader(pReader,&local_70,lVar7,&local_48,&local_60);
    if (lVar4 < 0) {
      return lVar4;
    }
    if (local_48 == 0xec) {
      local_64 = local_64 + 1;
    }
    else if (local_48 == 0x4dbb) {
      local_74 = local_74 + 1;
    }
    local_70 = local_70 + local_60;
    if (lVar7 < local_70) {
      return -2;
    }
  }
  if (local_70 != lVar7) {
    return -2;
  }
  if (0 < (int)local_74) {
    pEVar5 = (Entry *)operator_new__((ulong)local_74 << 5,(nothrow_t *)&std::nothrow);
    if (pEVar5 == (Entry *)0x0) {
      pSVar2->m_entries = (Entry *)0x0;
      return -1;
    }
    memset(pEVar5,0,(ulong)local_74 << 5);
    pSVar2->m_entries = pEVar5;
  }
  if ((int)local_64 < 1) {
    local_58 = pSVar2->m_void_elements;
  }
  else {
    local_58 = (VoidElement *)operator_new__((ulong)local_64 << 4,(nothrow_t *)&std::nothrow);
    pSVar2->m_void_elements = local_58;
    if (local_58 == (VoidElement *)0x0) {
      return -1;
    }
  }
  lVar4 = pSVar2->m_start;
  local_50 = pSVar2->m_entries;
  while( true ) {
    local_70 = lVar4;
    if (lVar7 <= lVar4) break;
    lVar6 = ParseElementHeader(pReader,&local_70,lVar7,&local_48,&local_60);
    pEVar5 = local_50;
    lVar1 = local_70;
    if (lVar6 < 0) {
      return lVar6;
    }
    if (local_48 == 0x4dbb && 0 < (int)local_74) {
      local_40 = local_60;
      bVar3 = ParseEntry(pReader,local_70,local_60,local_50);
      lVar6 = local_40;
      if (bVar3) {
        pEVar5->element_start = lVar4;
        pEVar5->element_size = (lVar1 - lVar4) + local_40;
        local_50 = pEVar5 + 1;
      }
    }
    else {
      lVar6 = local_60;
      if (0 < (int)local_64 && local_48 == 0xec) {
        local_58->element_start = lVar4;
        local_58->element_size = (local_70 - lVar4) + local_60;
        local_58 = local_58 + 1;
        lVar6 = local_60;
      }
    }
    lVar4 = lVar1 + lVar6;
    if (lVar7 < lVar4) {
      return -2;
    }
  }
  if (lVar4 != lVar7) {
    return -2;
  }
  lVar7 = (long)local_50 - (long)local_38->m_entries >> 5;
  if (lVar7 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63c,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)local_74 < lVar7) {
    __assert_fail("count_ <= entry_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63d,"long mkvparser::SeekHead::Parse()");
  }
  local_38->m_entry_count = (int)lVar7;
  lVar7 = (long)local_58 - (long)local_38->m_void_elements >> 4;
  if (lVar7 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x642,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)local_64 < lVar7) {
    __assert_fail("count_ <= void_element_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x643,"long mkvparser::SeekHead::Parse()");
  }
  local_38->m_void_element_count = (int)lVar7;
  return 0;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  int entry_count = 0;
  int void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek)
      ++entry_count;
    else if (id == libwebm::kMkvVoid)
      ++void_element_count;

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[entry_count];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements = new (std::nothrow) VoidElement[void_element_count];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(count_ <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(count_ <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}